

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O0

SNMP_ERROR_STATUS
ValueCallback::setValueForCallback(ValueCallback *callback,shared_ptr<BER_CONTAINER> *value)

{
  element_type *peVar1;
  SNMP_ERROR_STATUS valid;
  shared_ptr<BER_CONTAINER> *value_local;
  ValueCallback *callback_local;
  
  if ((callback->isSettable & 1U) == 0) {
    callback_local._4_4_ = READ_ONLY;
  }
  else {
    peVar1 = std::__shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>::get
                       (&value->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>);
    callback_local._4_4_ = (*callback->_vptr_ValueCallback[1])(callback,peVar1);
    if (callback_local._4_4_ == NO_ERROR) {
      callback->setOccurred = true;
    }
  }
  return callback_local._4_4_;
}

Assistant:

SNMP_ERROR_STATUS ValueCallback::setValueForCallback(ValueCallback* callback, const std::shared_ptr<BER_CONTAINER> &value){
    SNMP_LOGD("Setting value for callback of OID: %s\n", callback->OID->string().c_str());

    if(!callback->isSettable){
        return SETTING_NON_SETTABLE_ERROR;
    }

    SNMP_ERROR_STATUS valid = callback->setTypeWithValue(value.get());

    if(valid == NO_ERROR){
        callback->setOccurred = true;
    }

    return valid;
}